

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O0

void test_register_event_fails(void)

{
  undefined1 local_538 [8];
  cio_event_notifier ev;
  undefined1 local_510 [4];
  cio_error err;
  cio_eventloop loop;
  _func_int_int_int_int_epoll_event_ptr *epoll_ctrl_fakes [3];
  
  loop.epoll_events[99].data.ptr = epoll_ctl_save;
  epoll_ctl_fake.custom_fake_seq =
       (_func_int_int_int_int_epoll_event_ptr **)&loop.epoll_events[99].data;
  epoll_ctl_fake.custom_fake_seq_len = 3;
  memset(local_510,0,0x4e8);
  ev.registered_events = cio_eventloop_init((cio_eventloop *)local_510);
  UnityAssertEqualNumber
            (0,(long)(int)ev.registered_events,(char *)0x0,0x1be,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)epoll_create1_fake.call_count,(char *)0x0,0x1bf,UNITY_DISPLAY_STYLE_INT);
  ev.context._0_4_ = 0x2a;
  local_538 = (undefined1  [8])0x0;
  ev.write_callback = (_func_void_void_ptr_cio_epoll_error *)0x0;
  ev.registered_events =
       cio_linux_eventloop_add((cio_eventloop *)local_510,(cio_event_notifier *)local_538);
  UnityAssertEqualNumber
            (0,(long)(int)ev.registered_events,(char *)0x0,0x1c6,UNITY_DISPLAY_STYLE_INT);
  ev.registered_events =
       cio_linux_eventloop_register_read((cio_eventloop *)local_510,(cio_event_notifier *)local_538)
  ;
  if (ev.registered_events != CIO_SUCCESS) {
    UnityAssertEqualNumber
              (4,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x1ca,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((long)(int)local_510,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x1cb,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (3,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x1cc,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0x2a,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x1cd,UNITY_DISPLAY_STYLE_INT);
    cio_eventloop_destroy((cio_eventloop *)local_510);
    UnityAssertEqualNumber(2,(ulong)close_fake.call_count,(char *)0x0,0x1d0,UNITY_DISPLAY_STYLE_INT)
    ;
    return;
  }
  UnityFail(" Expression Evaluated To FALSE",0x1c9);
}

Assistant:

static void test_register_event_fails(void)
{
	int (*epoll_ctrl_fakes[])(int, int, int, struct epoll_event *) = {epoll_ctl_save, epoll_ctl_save, epoll_ctl_mod_fail};
	SET_CUSTOM_FAKE_SEQ(epoll_ctl, epoll_ctrl_fakes, ARRAY_SIZE(epoll_ctrl_fakes))

	static const int fake_fd = 42;
	struct cio_eventloop loop = {0};
	enum cio_error err = cio_eventloop_init(&loop);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(1, epoll_create1_fake.call_count);

	struct cio_event_notifier ev;
	ev.fd = fake_fd;
	ev.read_callback = NULL;
	ev.context = NULL;
	err = cio_linux_eventloop_add(&loop, &ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	err = cio_linux_eventloop_register_read(&loop, &ev);
	TEST_ASSERT(err != CIO_SUCCESS);
	TEST_ASSERT_EQUAL(4, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_MOD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_fd, epoll_ctl_fake.arg2_val);

	cio_eventloop_destroy(&loop);
	TEST_ASSERT_EQUAL(2, close_fake.call_count);
}